

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

CURLcode Curl_resolver_wait_resolv(Curl_easy *data,Curl_dns_entry **entry)

{
  undefined1 *puVar1;
  thread_data *ptVar2;
  int iVar3;
  CURLcode CVar4;
  
  iVar3 = Curl_thread_join(&((data->state).async.tdata)->thread_hnd);
  CVar4 = CURLE_OK;
  if ((entry != (Curl_dns_entry **)0x0) && (CVar4 = CURLE_OK, iVar3 != 0)) {
    ptVar2 = (data->state).async.tdata;
    CVar4 = Curl_addrinfo_callback(data,(ptVar2->tsd).sock_error,(ptVar2->tsd).res);
    (ptVar2->tsd).res = (Curl_addrinfo *)0x0;
  }
  puVar1 = &(data->state).async.field_0x28;
  *puVar1 = *puVar1 | 1;
  if (entry != (Curl_dns_entry **)0x0) {
    *entry = (data->state).async.dns;
  }
  if ((data->state).async.dns == (Curl_dns_entry *)0x0) {
    CVar4 = Curl_resolver_error(data);
  }
  destroy_async_data(&(data->state).async);
  if ((data->state).async.dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(data->conn,1);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct Curl_easy *data,
                                   struct Curl_dns_entry **entry)
{
  return thread_wait_resolv(data, entry, TRUE);
}